

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O1

void end_pass(gdmf *d)

{
  vw *all;
  pointer pcVar1;
  bool bVar2;
  string local_60;
  string local_40;
  
  all = d->all;
  all->eta = all->eta_decay_rate * all->eta;
  if (all->save_per_pass == true) {
    pcVar1 = (all->final_regressor_name)._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + (all->final_regressor_name)._M_string_length);
    save_predictor(all,&local_40,all->current_pass);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (all->holdout_set_off == false) {
    bVar2 = summarize_holdout_set(all,&d->no_win_counter);
    if (bVar2) {
      pcVar1 = (all->final_regressor_name)._M_dataplus._M_p;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + (all->final_regressor_name)._M_string_length);
      finalize_regressor(all,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    if ((d->early_stop_thres == d->no_win_counter) &&
       ((all->check_holdout_every_n_passes < 2 ||
        (all->current_pass % all->check_holdout_every_n_passes == 0)))) {
      set_done(all);
    }
  }
  return;
}

Assistant:

void end_pass(gdmf& d)
{
  vw* all = d.all;

  all->eta *= all->eta_decay_rate;
  if (all->save_per_pass)
    save_predictor(*all, all->final_regressor_name, all->current_pass);

  if (!all->holdout_set_off)
  {
    if (summarize_holdout_set(*all, d.no_win_counter))
      finalize_regressor(*all, all->final_regressor_name);
    if ((d.early_stop_thres == d.no_win_counter) &&
        ((all->check_holdout_every_n_passes <= 1) || ((all->current_pass % all->check_holdout_every_n_passes) == 0)))
      set_done(*all);
  }
}